

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

char * __thiscall cmMakefile::GetIncludeRegularExpression(cmMakefile *this)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"INCLUDE_REGULAR_EXPRESSION",&local_31);
  pcVar1 = GetProperty(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

const char* GetIncludeRegularExpression() const
    {
      return this->GetProperty("INCLUDE_REGULAR_EXPRESSION");
    }